

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *data;
  stbi_uc *psVar2;
  int local_5c;
  float *hdr;
  int i;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  int len_local;
  stbi_uc *buffer_local;
  
  iVar1 = stbi_jpeg_test_memory(buffer,len);
  if (iVar1 == 0) {
    iVar1 = stbi_png_test_memory(buffer,len);
    if (iVar1 == 0) {
      iVar1 = stbi_bmp_test_memory(buffer,len);
      if (iVar1 == 0) {
        iVar1 = stbi_psd_test_memory(buffer,len);
        if (iVar1 == 0) {
          iVar1 = stbi_dds_test_memory(buffer,len);
          if (iVar1 == 0) {
            iVar1 = stbi_hdr_test_memory(buffer,len);
            if (iVar1 == 0) {
              for (hdr._0_4_ = 0; (int)hdr < max_loaders; hdr._0_4_ = (int)hdr + 1) {
                iVar1 = (*loaders[(int)hdr]->test_memory)(buffer,len);
                if (iVar1 != 0) {
                  psVar2 = (*loaders[(int)hdr]->load_from_memory)(buffer,len,x,y,comp,req_comp);
                  return psVar2;
                }
              }
              iVar1 = stbi_tga_test_memory(buffer,len);
              if (iVar1 == 0) {
                e("Image not of any known type, or corrupt");
                buffer_local = (stbi_uc *)0x0;
              }
              else {
                buffer_local = stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
              }
            }
            else {
              data = stbi_hdr_load_from_memory(buffer,len,x,y,comp,req_comp);
              local_5c = req_comp;
              if (req_comp == 0) {
                local_5c = *comp;
              }
              buffer_local = hdr_to_ldr(data,*x,*y,local_5c);
            }
          }
          else {
            buffer_local = stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
          }
        }
        else {
          buffer_local = stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
        }
      }
      else {
        buffer_local = stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
      }
    }
    else {
      buffer_local = stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
    }
  }
  else {
    buffer_local = stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
  }
  return buffer_local;
}

Assistant:

unsigned char *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   int i;
   if (stbi_jpeg_test_memory(buffer,len))
      return stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_png_test_memory(buffer,len))
      return stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_bmp_test_memory(buffer,len))
      return stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_psd_test_memory(buffer,len))
      return stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
   #ifndef STBI_NO_DDS
   if (stbi_dds_test_memory(buffer,len))
      return stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len)) {
      float *hdr = stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
      return hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif
   for (i=0; i < max_loaders; ++i)
      if (loaders[i]->test_memory(buffer,len))
         return loaders[i]->load_from_memory(buffer,len,x,y,comp,req_comp);
   // test tga last because it's a crappy test!
   if (stbi_tga_test_memory(buffer,len))
      return stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
   return epuc("unknown image type", "Image not of any known type, or corrupt");
}